

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

BUFFER_HANDLE BUFFER_new(void)

{
  BUFFER_HANDLE pBVar1;
  
  pBVar1 = (BUFFER_HANDLE)calloc(1,0x10);
  if (pBVar1 != (BUFFER_HANDLE)0x0) {
    pBVar1->buffer = (uchar *)0x0;
    pBVar1->size = 0;
  }
  return pBVar1;
}

Assistant:

BUFFER_HANDLE BUFFER_new(void)
{
    BUFFER* temp = (BUFFER*)calloc(1, sizeof(BUFFER));
    /* Codes_SRS_BUFFER_07_002: [BUFFER_new shall return NULL on any error that occurs.] */
    if (temp != NULL)
    {
        temp->buffer = NULL;
        temp->size = 0;
    }
    return (BUFFER_HANDLE)temp;
}